

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::import_<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  bool *pbVar1;
  size_t sVar2;
  undefined8 uVar3;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> _Var4;
  Type ttype;
  bool bVar5;
  bool *pbVar6;
  char *pcVar7;
  TypeUse *pTVar8;
  string *this_00;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  Name name_00;
  Name NVar9;
  Name NVar10;
  Index pos;
  undefined1 auStack_238 [8];
  optional<wasm::Name> mod;
  optional<wasm::Name> nm;
  string local_1e8;
  string local_1c8;
  TypeUse local_1a8;
  TypeUse local_188;
  string local_168;
  string local_148;
  string local_128;
  _Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_108;
  undefined1 auStack_e8 [8];
  ImportNames names;
  undefined1 local_c0 [8];
  optional<wasm::Name> name;
  Result<wasm::WATParser::TypeUse> type;
  Result<wasm::WATParser::TypeUse> _val;
  
  this = &ctx->in;
  sVar2 = (ctx->in).pos;
  expected._M_str = "import";
  expected._M_len = 6;
  bVar5 = Lexer::takeSExprStart(this,expected);
  if (!bVar5) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeName((optional<wasm::Name> *)auStack_238,this);
  if (mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"expected import module name",
               (allocator<char> *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
    Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,this,&local_1e8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    this_00 = &local_1e8;
    goto LAB_00c3b5bd;
  }
  Lexer::takeName((optional<wasm::Name> *)
                  &mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_engaged,this);
  if (nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"expected import name",
               (allocator<char> *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
    Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,this,&local_1c8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    this_00 = &local_1c8;
    goto LAB_00c3b5bd;
  }
  auStack_e8 = auStack_238;
  names.mod.super_IString.str._M_len =
       mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  names.mod.super_IString.str._M_str =
       (char *)mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
  names.nm.super_IString.str._M_len =
       nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  expected_00._M_str = "func";
  expected_00._M_len = 4;
  bVar5 = Lexer::takeSExprStart(this,expected_00);
  pos = (Index)sVar2;
  if (bVar5) {
    Lexer::takeID((optional<wasm::Name> *)local_c0,this);
    pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged;
    typeuse<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::TypeUse> *)pbVar1,ctx,true);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                    ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)pbVar1);
    if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                 (string *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
LAB_00c3b4fd:
      std::__cxx11::string::~string
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20))
      ;
LAB_00c3b7cf:
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                        &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_engaged);
      return __return_storage_ptr__;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                      ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
    names.nm.super_IString.str._M_str =
         (char *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                 _M_len;
    _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_index = '\0';
    _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._33_7_ = 0;
    pTVar8 = (TypeUse *)0x0;
    if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] == '\0') {
      pTVar8 = (TypeUse *)pbVar1;
    }
    TypeUse::TypeUse(&local_1a8,pTVar8);
    pcVar7 = names.nm.super_IString.str._M_str;
    if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
      pcVar7 = (char *)0x0;
      local_c0 = (undefined1  [8])(char *)0x0;
    }
    local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    name_00.super_IString.str._M_str = pcVar7;
    name_00.super_IString.str._M_len = (size_t)local_c0;
    ParseModuleTypesCtx::addFunc
              ((Result<wasm::Ok> *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),ctx,
               name_00,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                       ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
               (ImportNames *)auStack_e8,&local_1a8,
               (optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               &nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged,
               (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               &local_108,pos);
    std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
    ~_Vector_base(&local_108);
    std::_Optional_payload_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::
    _M_reset((_Optional_payload_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
              *)&nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_engaged);
    std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
              (&local_1a8.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>);
    std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
              ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
               ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
    if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                 (string *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
LAB_00c3b7bd:
      std::__cxx11::string::~string
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      goto LAB_00c3b7cf;
    }
LAB_00c3b88a:
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                      &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged);
  }
  else {
    expected_01._M_str = "table";
    expected_01._M_len = 5;
    bVar5 = Lexer::takeSExprStart(this,expected_01);
    if (bVar5) {
      Lexer::takeID((optional<wasm::Name> *)local_c0,this);
      pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged;
      tabletype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Type> *)pbVar1,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)pbVar1);
      if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage
          ._M_storage[0x18] == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
LAB_00c3b9ed:
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                   &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        return __return_storage_ptr__;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
        name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
             (size_t)(char *)0x0;
        local_c0 = (undefined1  [8])0x0;
      }
      _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_index = '\0';
      _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._33_7_ = 0;
      ttype.id._4_4_ =
           name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._20_4_;
      ttype.id._0_1_ =
           name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._M_engaged;
      ttype.id._1_3_ =
           name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._17_3_;
      NVar9.super_IString.str._M_str =
           (char *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
      NVar9.super_IString.str._M_len = (size_t)local_c0;
      ParseModuleTypesCtx::addTable
                ((Result<wasm::Ok> *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),ctx,
                 NVar9,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                       ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                 (ImportNames *)auStack_e8,ttype,pos);
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage
          ._M_storage[0x18] == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        goto LAB_00c3b9ed;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
    }
    else {
      expected_02._M_str = "memory";
      expected_02._M_len = 6;
      bVar5 = Lexer::takeSExprStart(this,expected_02);
      if (bVar5) {
        Lexer::takeID((optional<wasm::Name> *)local_c0,this);
        pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged;
        memtype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)pbVar1,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                   (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)pbVar1);
        if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                     (string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
LAB_00c3b95f:
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged);
          return __return_storage_ptr__;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._33_7_ = 0;
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] = '\0';
        std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                  ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                     (string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          goto LAB_00c3b95f;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
      }
      else {
        expected_03._M_str = "global";
        expected_03._M_len = 6;
        bVar5 = Lexer::takeSExprStart(this,expected_03);
        if (!bVar5) {
          expected_04._M_str = "tag";
          expected_04._M_len = 3;
          bVar5 = Lexer::takeSExprStart(this,expected_04);
          if (!bVar5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,"expected import description",
                       (allocator<char> *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
            Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged,this,&local_168);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged);
            std::__cxx11::string::~string
                      ((string *)
                       &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged);
            this_00 = &local_168;
            goto LAB_00c3b5bd;
          }
          Lexer::takeID((optional<wasm::Name> *)local_c0,this);
          pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged;
          typeuse<wasm::WATParser::ParseModuleTypesCtx>
                    ((Result<wasm::WATParser::TypeUse> *)pbVar1,ctx,true);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                          ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20
                          ),(_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)pbVar1);
          if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
              _M_storage._M_storage[0x18] != '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                              ((long)&type.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                              0x20));
            names.nm.super_IString.str._M_str =
                 (char *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                         str._M_len;
            _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_index = '\0';
            _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._33_7_ = 0;
            pTVar8 = (TypeUse *)0x0;
            if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                _M_storage._M_storage[0x18] == '\0') {
              pTVar8 = (TypeUse *)pbVar1;
            }
            TypeUse::TypeUse(&local_188,pTVar8);
            pcVar7 = names.nm.super_IString.str._M_str;
            if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
              local_c0 = (undefined1  [8])(char *)0x0;
              pcVar7 = (char *)0x0;
            }
            NVar10.super_IString.str._M_str = pcVar7;
            NVar10.super_IString.str._M_len = (size_t)local_c0;
            ParseModuleTypesCtx::addTag
                      ((Result<wasm::Ok> *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                       ctx,NVar10,
                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                       ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                       (ImportNames *)auStack_e8,&local_188,pos);
            std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                      (&local_188.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)
            ;
            std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                      ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
                       ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
            if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                _M_storage._M_storage[0x18] != '\x01') goto LAB_00c3b88a;
            std::__cxx11::string::string
                      ((string *)
                       ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                       (string *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       (__index_type *)
                       ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
            goto LAB_00c3b7bd;
          }
          std::__cxx11::string::string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                     (string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          goto LAB_00c3b4fd;
        }
        Lexer::takeID((optional<wasm::Name> *)local_c0,this);
        pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged;
        globaltype<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::WATParser::GlobalType> *)pbVar1,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                        (_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err> *)pbVar1);
        if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                     (string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                              ((long)&type.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                              0x20));
LAB_00c3baf7:
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                              &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged);
          return __return_storage_ptr__;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                          ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20
                          ));
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._33_7_ = 0;
        pbVar6 = (bool *)0x0;
        if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\0') {
          pbVar6 = pbVar1;
        }
        uVar3 = *(undefined8 *)(pbVar6 + 8);
        _Var4._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
             (ctx->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[ctx->index]._M_t.
             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
        *(bool *)((long)_Var4._M_t.
                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) =
             name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_4_ != 0;
        *(undefined8 *)
         ((long)_Var4._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = uVar3;
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] = '\0';
        std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                  ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                     (string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          goto LAB_00c3baf7;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                          &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_engaged);
      }
    }
  }
  bVar5 = Lexer::takeRParen(this);
  if (bVar5) {
    bVar5 = Lexer::takeRParen(this);
    if (bVar5) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"expected end of import",
               (allocator<char> *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
    Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,this,&local_128);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    this_00 = &local_128;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"expected end of import description",
               (allocator<char> *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
    Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,this,&local_148);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    this_00 = &local_148;
  }
LAB_00c3b5bd:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> import_(Ctx& ctx) {
  auto pos = ctx.in.getPos();

  if (!ctx.in.takeSExprStart("import"sv)) {
    return {};
  }

  auto mod = ctx.in.takeName();
  if (!mod) {
    return ctx.in.err("expected import module name");
  }

  auto nm = ctx.in.takeName();
  if (!nm) {
    return ctx.in.err("expected import name");
  }
  ImportNames names{*mod, *nm};

  if (ctx.in.takeSExprStart("func"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    // TODO: function import annotations
    CHECK_ERR(ctx.addFunc(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, {}, pos));
  } else if (ctx.in.takeSExprStart("table"sv)) {
    auto name = ctx.in.takeID();
    auto type = tabletype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTable(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("memory"sv)) {
    auto name = ctx.in.takeID();
    auto type = memtype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addMemory(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("global"sv)) {
    auto name = ctx.in.takeID();
    auto type = globaltype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addGlobal(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, pos));
  } else if (ctx.in.takeSExprStart("tag"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTag(name ? *name : Name{}, {}, &names, *type, pos));
  } else {
    return ctx.in.err("expected import description");
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import description");
  }
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import");
  }

  return Ok{};
}